

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void sexp_define_type_predicate(sexp_conflict ctx,sexp_conflict env,char *cname,sexp_uint_t type)

{
  sexp_conflict op;
  sexp_conflict name;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &name;
  name = (sexp_conflict)0x43e;
  local_50.var = &op;
  op = (sexp_conflict)0x43e;
  local_50.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_50;
  name = (sexp_conflict)sexp_c_string(ctx,cname,0xffffffffffffffff);
  op = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,type * 2 + 1);
  name = (sexp_conflict)sexp_intern(ctx,cname,0xffffffffffffffff);
  sexp_env_define(ctx,env,name,op);
  (ctx->value).context.saves = local_40.next;
  return;
}

Assistant:

static void sexp_define_type_predicate (sexp ctx, sexp env, const char *cname, sexp_uint_t type) {
  sexp_gc_var2(name, op);
  sexp_gc_preserve2(ctx, name, op);
  name = sexp_c_string(ctx, cname, -1);
  op = sexp_make_type_predicate(ctx, name, sexp_make_fixnum(type));
  sexp_env_define(ctx, env, name=sexp_intern(ctx, cname, -1), op);
  sexp_gc_release2(ctx);
}